

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# secp256k1.c
# Opt level: O2

int secp256k1_ec_pubkey_tweak_add_helper(secp256k1_ge *p,uchar *tweak32)

{
  int iVar1;
  int overflow;
  secp256k1_scalar term;
  secp256k1_gej local_98;
  
  overflow = 0;
  secp256k1_scalar_set_b32(&term,tweak32,&overflow);
  iVar1 = 0;
  if (overflow == 0) {
    local_98.infinity = p->infinity;
    local_98.x.n[0] = (p->x).n[0];
    local_98.x.n[1] = (p->x).n[1];
    local_98.x.n[2] = (p->x).n[2];
    local_98.x.n[3] = (p->x).n[3];
    local_98.x.n[4] = (p->x).n[4];
    local_98.y.n[0] = (p->y).n[0];
    local_98.y.n[1] = (p->y).n[1];
    local_98.y.n[2] = (p->y).n[2];
    local_98.y.n[3] = (p->y).n[3];
    local_98.y.n[4] = (p->y).n[4];
    local_98.z.n[0] = 1;
    local_98.z.n[1] = 0;
    local_98.z.n[2] = 0;
    local_98.z.n[3] = 0;
    local_98.z.n[4] = 0;
    secp256k1_ecmult(&local_98,&local_98,&secp256k1_scalar_one,&term);
    iVar1 = 0;
    if (local_98.infinity == 0) {
      secp256k1_ge_set_gej(p,&local_98);
      iVar1 = 1;
    }
  }
  return iVar1;
}

Assistant:

static int secp256k1_ec_pubkey_tweak_add_helper(secp256k1_ge *p, const unsigned char *tweak32) {
    secp256k1_scalar term;
    int overflow = 0;
    secp256k1_scalar_set_b32(&term, tweak32, &overflow);
    return !overflow && secp256k1_eckey_pubkey_tweak_add(p, &term);
}